

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntVect.H
# Opt level: O2

Box * __thiscall amrex::Box::coarsen(Box *this,int ref_ratio)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int dir;
  uint uVar4;
  long lVar5;
  int local_18 [6];
  
  local_18[3] = ref_ratio;
  local_18[4] = ref_ratio;
  local_18[5] = ref_ratio;
  if (ref_ratio == 1) {
    return this;
  }
  uVar2 = (this->smallend).vect[0];
  if (ref_ratio == 4) {
    (this->smallend).vect[0] = (int)uVar2 >> 2;
    uVar2 = (this->smallend).vect[1];
LAB_004199dd:
    (this->smallend).vect[1] = (int)uVar2 >> 2;
    uVar2 = (this->smallend).vect[2];
    if ((int)uVar2 < 0) {
      uVar2 = (int)uVar2 >> 2;
    }
    else {
      uVar2 = uVar2 >> 2;
    }
  }
  else if (ref_ratio == 2) {
    (this->smallend).vect[0] = (int)uVar2 >> 1;
    piVar1 = (this->smallend).vect + 1;
    *piVar1 = *piVar1 >> 1;
    uVar2 = (this->smallend).vect[2];
    if ((int)uVar2 < 0) {
      uVar2 = (int)uVar2 >> 1;
    }
    else {
      uVar2 = uVar2 >> 1;
    }
  }
  else {
    if ((int)uVar2 < 0) {
      uVar2 = ~((int)~uVar2 / ref_ratio);
    }
    else {
      uVar2 = (int)uVar2 / ref_ratio;
    }
    (this->smallend).vect[0] = uVar2;
    uVar2 = (this->smallend).vect[1];
    if (ref_ratio == 4) goto LAB_004199dd;
    if ((int)uVar2 < 0) {
      uVar2 = ~((int)~uVar2 / ref_ratio);
    }
    else {
      uVar2 = (int)uVar2 / ref_ratio;
    }
    (this->smallend).vect[1] = uVar2;
    uVar2 = (this->smallend).vect[2];
    if ((int)uVar2 < 0) {
      uVar2 = ~((int)~uVar2 / ref_ratio);
    }
    else {
      uVar2 = (int)uVar2 / ref_ratio;
    }
  }
  (this->smallend).vect[2] = uVar2;
  uVar2 = (this->btype).itype;
  if (uVar2 != 0) {
    local_18[0] = 0;
    local_18[1] = 0;
    local_18[2] = 0;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      if (((uVar2 >> ((uint)lVar5 & 0x1f) & 1) != 0) &&
         ((this->bigend).vect[lVar5] % local_18[lVar5 + 3] != 0)) {
        local_18[lVar5] = 1;
      }
    }
    uVar2 = (this->bigend).vect[0];
    if (ref_ratio == 4) {
      uVar2 = (int)uVar2 >> 2;
      uVar4 = (this->bigend).vect[1];
    }
    else {
      if (ref_ratio == 2) {
        uVar2 = (int)uVar2 >> 1;
        uVar3 = (this->bigend).vect[2];
        uVar4 = (this->bigend).vect[1] >> 1;
        (this->bigend).vect[1] = uVar4;
        if ((int)uVar3 < 0) {
          uVar3 = (int)uVar3 >> 1;
        }
        else {
          uVar3 = uVar3 >> 1;
        }
        goto LAB_00419b90;
      }
      if (ref_ratio == 1) {
        uVar4 = (this->bigend).vect[1];
        uVar3 = (this->bigend).vect[2];
        goto LAB_00419b90;
      }
      if ((int)uVar2 < 0) {
        uVar2 = ~((int)~uVar2 / ref_ratio);
      }
      else {
        uVar2 = (int)uVar2 / ref_ratio;
      }
      uVar4 = (this->bigend).vect[1];
      if (ref_ratio != 4) {
        if ((int)uVar4 < 0) {
          uVar4 = ~((int)~uVar4 / ref_ratio);
        }
        else {
          uVar4 = (int)uVar4 / ref_ratio;
        }
        (this->bigend).vect[1] = uVar4;
        uVar3 = (this->bigend).vect[2];
        if ((int)uVar3 < 0) {
          uVar3 = ~((int)~uVar3 / ref_ratio);
        }
        else {
          uVar3 = (int)uVar3 / ref_ratio;
        }
        goto LAB_00419b90;
      }
    }
    uVar4 = (int)uVar4 >> 2;
    (this->bigend).vect[1] = uVar4;
    uVar3 = (this->bigend).vect[2];
    if ((int)uVar3 < 0) {
      uVar3 = (int)uVar3 >> 2;
    }
    else {
      uVar3 = uVar3 >> 2;
    }
LAB_00419b90:
    (this->bigend).vect[0] = uVar2 + local_18[0];
    (this->bigend).vect[1] = uVar4 + local_18[1];
    (this->bigend).vect[2] = uVar3 + local_18[2];
    return this;
  }
  uVar2 = (this->bigend).vect[0];
  if (ref_ratio == 4) {
    (this->bigend).vect[0] = (int)uVar2 >> 2;
    uVar2 = (this->bigend).vect[1];
  }
  else {
    if (ref_ratio == 2) {
      (this->bigend).vect[0] = (int)uVar2 >> 1;
      piVar1 = (this->bigend).vect + 1;
      *piVar1 = *piVar1 >> 1;
      uVar2 = (this->bigend).vect[2];
      if ((int)uVar2 < 0) {
        uVar2 = (int)uVar2 >> 1;
      }
      else {
        uVar2 = uVar2 >> 1;
      }
      goto LAB_00419bca;
    }
    if ((int)uVar2 < 0) {
      uVar2 = ~((int)~uVar2 / ref_ratio);
    }
    else {
      uVar2 = (int)uVar2 / ref_ratio;
    }
    (this->bigend).vect[0] = uVar2;
    uVar2 = (this->bigend).vect[1];
    if (ref_ratio != 4) {
      if ((int)uVar2 < 0) {
        uVar2 = ~((int)~uVar2 / ref_ratio);
      }
      else {
        uVar2 = (int)uVar2 / ref_ratio;
      }
      (this->bigend).vect[1] = uVar2;
      uVar2 = (this->bigend).vect[2];
      if ((int)uVar2 < 0) {
        uVar2 = ~((int)~uVar2 / ref_ratio);
      }
      else {
        uVar2 = (int)uVar2 / ref_ratio;
      }
      goto LAB_00419bca;
    }
  }
  (this->bigend).vect[1] = (int)uVar2 >> 2;
  uVar2 = (this->bigend).vect[2];
  if ((int)uVar2 < 0) {
    uVar2 = (int)uVar2 >> 2;
  }
  else {
    uVar2 = uVar2 >> 2;
  }
LAB_00419bca:
  (this->bigend).vect[2] = uVar2;
  return this;
}

Assistant:

constexpr IntVect (int i) noexcept : vect{AMREX_D_DECL(i,i,i)} {}